

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O3

Pattern * slang::ast::VariablePattern::fromSyntax(VariablePatternSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  undefined1 auVar1 [16];
  int iVar2;
  size_t __n;
  SourceLocation args;
  InvalidPattern *pIVar3;
  string_view name;
  SourceRange local_40;
  
  this = ((context->scope).ptr)->compilation;
  name = parsing::Token::valueText(&syntax->variableName);
  __n = name._M_len;
  args = (SourceLocation)context->firstTempVar;
  do {
    if (args == (SourceLocation)0x0) {
      args = (SourceLocation)Scope::find((context->scope).ptr,name);
      if (((args == (SourceLocation)0x0) || (*(int *)args != 0x47)) ||
         (*(VariablePatternSyntax **)((long)args + 0x38) != syntax)) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_40.endLoc;
        local_40 = (SourceRange)(auVar1 << 0x40);
        pIVar3 = BumpAllocator::emplace<slang::ast::InvalidPattern,slang::ast::Pattern_const*&>
                           (&this->super_BumpAllocator,(Pattern **)&local_40);
      }
      else {
        local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
LAB_002ddef8:
        pIVar3 = (InvalidPattern *)
                 BumpAllocator::
                 emplace<slang::ast::VariablePattern,slang::ast::PatternVarSymbol_const&,slang::SourceRange>
                           (&this->super_BumpAllocator,(PatternVarSymbol *)args,&local_40);
      }
      return &pIVar3->super_Pattern;
    }
    if (((string_view *)((long)args + 8))->_M_len == __n) {
      if (__n != 0) {
        iVar2 = bcmp(*(char **)((long)args + 0x10),name._M_str,__n);
        if (iVar2 != 0) goto LAB_002dde81;
      }
      if (*(int *)args == 0x47) {
        local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        goto LAB_002ddef8;
      }
    }
LAB_002dde81:
    args = *(SourceLocation *)((long)args + 0x158);
  } while( true );
}

Assistant:

Pattern& VariablePattern::fromSyntax(const VariablePatternSyntax& syntax,
                                     const ASTContext& context) {
    // The pattern var has already been created in our scope, so just look it up.
    auto& comp = context.getCompilation();
    auto name = syntax.variableName.valueText();
    auto currVar = context.firstTempVar;
    while (currVar) {
        if (currVar->name == name && currVar->kind == SymbolKind::PatternVar) {
            return *comp.emplace<VariablePattern>(currVar->as<PatternVarSymbol>(),
                                                  syntax.sourceRange());
        }
        currVar = currVar->nextTemp;
    }

    auto var = context.scope->find(name);
    if (!var || var->kind != SymbolKind::PatternVar || var->getSyntax() != &syntax) {
        // Some other error has occurred, likely a duplicate name,
        // so just return an error.
        return badPattern(comp, nullptr);
    }

    return *comp.emplace<VariablePattern>(var->as<PatternVarSymbol>(), syntax.sourceRange());
}